

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestReadCustomFilesCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestReadCustomFilesCommand::Clone(cmCTestReadCustomFilesCommand *this)

{
  cmCommand *this_00;
  cmCTestReadCustomFilesCommand *ni;
  cmCTestReadCustomFilesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x40);
  cmCTestReadCustomFilesCommand((cmCTestReadCustomFilesCommand *)this_00);
  this_00[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestCommand).CTest;
  return this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestReadCustomFilesCommand* ni = new cmCTestReadCustomFilesCommand;
    ni->CTest = this->CTest;
    return ni;
  }